

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedTimeZone::getRawOffset(RuleBasedTimeZone *this)

{
  UDate UVar1;
  undefined1 local_1c [4];
  int32_t local_18;
  int32_t dst;
  int32_t raw;
  UErrorCode status;
  RuleBasedTimeZone *this_local;
  
  dst = 0;
  _raw = this;
  UVar1 = uprv_getUTCtime_63();
  (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
            (UVar1 * 1000.0,this,0,&local_18,local_1c,&dst);
  return local_18;
}

Assistant:

int32_t
RuleBasedTimeZone::getRawOffset(void) const {
    // Note: This implementation returns standard GMT offset
    // as of current time.
    UErrorCode status = U_ZERO_ERROR;
    int32_t raw, dst;
    getOffset(uprv_getUTCtime() * U_MILLIS_PER_SECOND,
        FALSE, raw, dst, status);
    return raw;
}